

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# question_1.cpp
# Opt level: O1

int main(void)

{
  double *__last;
  double dVar1;
  double dVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  double *pdVar6;
  ostream *poVar7;
  double *pdVar8;
  long lVar9;
  double *__i;
  double *pdVar10;
  double *pdVar11;
  double *pdVar12;
  ulong uVar13;
  double dVar14;
  int N;
  double da;
  uint local_4c;
  double local_48;
  undefined8 uStack_40;
  
  __isoc99_scanf("%d",&local_4c);
  if (0 < (int)local_4c) {
    pdVar8 = num;
    lVar9 = 0;
    do {
      __isoc99_scanf("%lf",pdVar8);
      lVar9 = lVar9 + 1;
      pdVar8 = pdVar8 + 1;
    } while (lVar9 < (int)local_4c);
  }
  uVar4 = local_4c;
  pdVar8 = num;
  if (local_4c != 0) {
    uVar5 = (ulong)(int)local_4c;
    __last = num + uVar5;
    lVar9 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    std::__introsort_loop<double*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(double,double)>>
              (num,__last,(ulong)(((uint)lVar9 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(double,_double)>)0x1011cc);
    if ((int)uVar4 < 0x11) {
      if (uVar4 != 1) {
        pdVar11 = num + 1;
        pdVar12 = num;
        do {
          pdVar10 = pdVar11;
          dVar2 = num[0];
          dVar1 = pdVar12[1];
          dVar14 = round(dVar1);
          local_48 = ABS(dVar1 - dVar14);
          uStack_40 = 0;
          dVar14 = round(dVar2);
          bVar3 = dVar1 < dVar2;
          if (1e-06 <= ABS(local_48 - ABS(dVar2 - dVar14))) {
            bVar3 = local_48 < ABS(dVar2 - dVar14);
          }
          if (bVar3) {
            memmove((void *)((long)pdVar12 + (0x10 - (long)(pdVar10 + -0x20810))),num,
                    (size_t)(pdVar10 + -0x20810));
            num[0] = dVar1;
          }
          else {
            dVar2 = *pdVar12;
            dVar14 = round(dVar2);
            bVar3 = local_48 < ABS(dVar2 - dVar14);
            if (ABS(local_48 - ABS(dVar2 - dVar14)) < 1e-06) {
              bVar3 = dVar1 < dVar2;
            }
            pdVar11 = pdVar10;
            if (bVar3) {
              do {
                dVar2 = pdVar11[-2];
                *pdVar11 = pdVar11[-1];
                dVar14 = round(dVar2);
                bVar3 = dVar1 < dVar2;
                if (1e-06 <= ABS(local_48 - ABS(dVar2 - dVar14))) {
                  bVar3 = local_48 < ABS(dVar2 - dVar14);
                }
                pdVar11 = pdVar11 + -1;
              } while (bVar3);
            }
            *pdVar11 = dVar1;
          }
          pdVar11 = pdVar10 + 1;
          pdVar12 = pdVar10;
        } while (pdVar10 + 1 != __last);
      }
    }
    else {
      pdVar10 = num + 0x10;
      pdVar11 = num + 1;
      pdVar12 = num;
      do {
        pdVar6 = pdVar11;
        dVar2 = num[0];
        dVar1 = pdVar12[1];
        dVar14 = round(dVar1);
        local_48 = ABS(dVar1 - dVar14);
        uStack_40 = 0;
        dVar14 = round(dVar2);
        bVar3 = dVar1 < dVar2;
        if (1e-06 <= ABS(local_48 - ABS(dVar2 - dVar14))) {
          bVar3 = local_48 < ABS(dVar2 - dVar14);
        }
        if (bVar3) {
          memmove((void *)((long)pdVar12 + (0x10 - (long)(pdVar6 + -0x20810))),num,
                  (size_t)(pdVar6 + -0x20810));
          num[0] = dVar1;
        }
        else {
          dVar2 = *pdVar12;
          dVar14 = round(dVar2);
          bVar3 = local_48 < ABS(dVar2 - dVar14);
          if (ABS(local_48 - ABS(dVar2 - dVar14)) < 1e-06) {
            bVar3 = dVar1 < dVar2;
          }
          pdVar11 = pdVar6;
          if (bVar3) {
            do {
              dVar2 = pdVar11[-2];
              *pdVar11 = pdVar11[-1];
              dVar14 = round(dVar2);
              bVar3 = dVar1 < dVar2;
              if (1e-06 <= ABS(local_48 - ABS(dVar2 - dVar14))) {
                bVar3 = local_48 < ABS(dVar2 - dVar14);
              }
              pdVar11 = pdVar11 + -1;
            } while (bVar3);
          }
          *pdVar11 = dVar1;
        }
        pdVar11 = pdVar6 + 1;
        pdVar12 = pdVar6;
      } while (pdVar6 + 1 != num + 0x10);
      do {
        dVar1 = pdVar10[-1];
        dVar2 = *pdVar10;
        dVar14 = round(dVar2);
        local_48 = ABS(dVar2 - dVar14);
        uStack_40 = 0;
        dVar14 = round(dVar1);
        bVar3 = dVar2 < dVar1;
        if (1e-06 <= ABS(local_48 - ABS(dVar1 - dVar14))) {
          bVar3 = local_48 < ABS(dVar1 - dVar14);
        }
        pdVar11 = pdVar10;
        if (bVar3) {
          do {
            dVar1 = pdVar11[-2];
            *pdVar11 = pdVar11[-1];
            dVar14 = round(dVar1);
            bVar3 = dVar2 < dVar1;
            if (1e-06 <= ABS(local_48 - ABS(dVar1 - dVar14))) {
              bVar3 = local_48 < ABS(dVar1 - dVar14);
            }
            pdVar11 = pdVar11 + -1;
          } while (bVar3);
        }
        *pdVar11 = dVar2;
        pdVar10 = pdVar10 + 1;
      } while (pdVar10 != __last);
    }
  }
  uVar5 = (ulong)local_4c;
  if (0 < (int)local_4c) {
    uVar13 = 0;
    do {
      lVar9 = std::cout;
      if (uVar13 == (int)uVar5 - 1) {
        *(undefined8 *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) = 6;
        std::ostream::_M_insert<double>(*pdVar8);
      }
      else {
        memmove[*(long *)(std::cout + -0x18)] =
             (code)((byte)memmove[*(long *)(std::cout + -0x18)] | 4);
        *(undefined8 *)(std::ios_base::Init::Init + *(long *)(lVar9 + -0x18)) = 6;
        poVar7 = std::ostream::_M_insert<double>(*pdVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      }
      uVar13 = uVar13 + 1;
      uVar5 = (ulong)(int)local_4c;
      pdVar8 = pdVar8 + 1;
    } while ((long)uVar13 < (long)uVar5);
  }
  return 0;
}

Assistant:

int main()
{
    int N;
    scanf("%d",&N);
    for (int i = 0; i < N; ++i) {
        scanf("%lf",&num[i]);

    }
    sort(num,num + N,cmp);
    for (int j = 0; j < N; ++j) {
        if(j != N - 1)
        {
            //printf("%.6lf ",num[j]);
            cout.setf(ios::fixed);          //fixed表示不带指数域，若要用指数域则使用scientific
            cout << setprecision(6) << num[j] << " ";
        }
        else
            //printf("%.6lf",num[j]);
            cout << setprecision(6) << num[j];
    }
    return 0;
}